

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O3

void Abc_FrameDeallocate(Abc_Frame_t *p)

{
  void *pvVar1;
  Vec_Wec_t *__ptr;
  Abc_Frame_t *pAVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  Ndr_Data_t *p_1;
  long lVar7;
  Abc_Frame_t *pAVar8;
  
  Rwt_ManGlobalStop();
  pVVar5 = p->vAbcObjIds;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
    }
    free(pVVar5);
  }
  pVVar4 = p->vCexVec;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    iVar3 = pVVar4->nSize;
    if (0 < iVar3) {
      lVar7 = 0;
      do {
        if ((void *)0x2 < pVVar4->pArray[lVar7]) {
          free(pVVar4->pArray[lVar7]);
          iVar3 = pVVar4->nSize;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar3);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  pVVar4 = p->vPoEquivs;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    iVar3 = pVVar4->nSize;
    if (0 < iVar3) {
      lVar7 = 0;
      do {
        pvVar1 = pVVar4->pArray[lVar7];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
          }
          free(pvVar1);
          iVar3 = pVVar4->nSize;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar3);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  pVVar5 = p->vStatuses;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
    }
    free(pVVar5);
  }
  if ((Dec_Man_t *)p->pManDec != (Dec_Man_t *)0x0) {
    Dec_ManStop((Dec_Man_t *)p->pManDec);
  }
  if (p->dd != (DdManager *)0x0) {
    Extra_StopManager(p->dd);
  }
  pVVar4 = p->vStore;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  if ((Aig_Man_t *)p->pSave1 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave1);
  }
  if ((Aig_Man_t *)p->pSave2 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave2);
  }
  if ((Aig_Man_t *)p->pSave3 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave3);
  }
  if ((Aig_Man_t *)p->pSave4 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave4);
  }
  if ((If_DsdMan_t *)p->pManDsd != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd,0);
  }
  if ((If_DsdMan_t *)p->pManDsd2 != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd2,0);
  }
  if (p->pNtkBackup != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pNtkBackup);
  }
  pVVar4 = p->vPlugInComBinPairs;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        if (pVVar4->pArray[lVar7] != (void *)0x0) {
          free(pVVar4->pArray[lVar7]);
          pVVar4 = p->vPlugInComBinPairs;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar4->nSize);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  pVVar5 = p->vIndFlops;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vIndFlops->pArray = (int *)0x0;
      pVVar5 = p->vIndFlops;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_0034cb6d;
    }
    free(pVVar5);
    p->vIndFlops = (Vec_Int_t *)0x0;
  }
LAB_0034cb6d:
  pVVar4 = p->vLTLProperties_global;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
      p->vLTLProperties_global->pArray = (void **)0x0;
      pVVar4 = p->vLTLProperties_global;
      if (pVVar4 == (Vec_Ptr_t *)0x0) goto LAB_0034cbb5;
    }
    free(pVVar4);
    p->vLTLProperties_global = (Vec_Ptr_t *)0x0;
  }
LAB_0034cbb5:
  pVVar4 = p->vSignalNames;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    iVar3 = pVVar4->nSize;
    if (0 < iVar3) {
      lVar7 = 0;
      do {
        if ((void *)0x2 < pVVar4->pArray[lVar7]) {
          free(pVVar4->pArray[lVar7]);
          iVar3 = pVVar4->nSize;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar3);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  if (p->pSpecName != (char *)0x0) {
    free(p->pSpecName);
    p->pSpecName = (char *)0x0;
  }
  Abc_FrameDeleteAllNetworks(p);
  if (p->pDrivingCell != (char *)0x0) {
    free(p->pDrivingCell);
    p->pDrivingCell = (char *)0x0;
  }
  if (p->pCex2 != (Abc_Cex_t *)0x0) {
    free(p->pCex2);
    p->pCex2 = (Abc_Cex_t *)0x0;
  }
  if (p->pCex != (Abc_Cex_t *)0x0) {
    free(p->pCex);
    p->pCex = (Abc_Cex_t *)0x0;
  }
  pVVar5 = p->pAbcWlcInv;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->pAbcWlcInv->pArray = (int *)0x0;
      pVVar5 = p->pAbcWlcInv;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_0034ccc4;
    }
    free(pVVar5);
    p->pAbcWlcInv = (Vec_Int_t *)0x0;
  }
LAB_0034ccc4:
  Abc_NamDeref(s_GlobalFrame->pJsonStrs);
  pAVar2 = s_GlobalFrame;
  __ptr = s_GlobalFrame->vJsonObjs;
  pAVar8 = s_GlobalFrame;
  if (__ptr != (Vec_Wec_t *)0x0) {
    iVar3 = __ptr->nCap;
    pVVar5 = __ptr->pArray;
    if (iVar3 < 1) {
      if (pVVar5 != (Vec_Int_t *)0x0) goto LAB_0034cd37;
    }
    else {
      lVar7 = 8;
      lVar6 = 0;
      do {
        pvVar1 = *(void **)((long)&pVVar5->nCap + lVar7);
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
          pVVar5 = __ptr->pArray;
          *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
          iVar3 = __ptr->nCap;
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar6 < iVar3);
LAB_0034cd37:
      free(pVVar5);
    }
    pAVar8 = s_GlobalFrame;
    free(__ptr);
    pAVar2->vJsonObjs = (Vec_Wec_t *)0x0;
  }
  pvVar1 = pAVar8->pNdr;
  if (pvVar1 != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 8));
    free(*(void **)((long)pvVar1 + 0x10));
    free(pvVar1);
  }
  if (pAVar8->pNdrArray != (int *)0x0) {
    free(pAVar8->pNdrArray);
    pAVar8->pNdrArray = (int *)0x0;
  }
  Gia_ManStopP(&p->pGiaMiniAig);
  Gia_ManStopP(&p->pGiaMiniLut);
  pVVar5 = p->vCopyMiniAig;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vCopyMiniAig->pArray = (int *)0x0;
      pVVar5 = p->vCopyMiniAig;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_0034cdfb;
    }
    free(pVVar5);
    p->vCopyMiniAig = (Vec_Int_t *)0x0;
  }
LAB_0034cdfb:
  pVVar5 = p->vCopyMiniLut;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vCopyMiniLut->pArray = (int *)0x0;
      pVVar5 = p->vCopyMiniLut;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_0034ce43;
    }
    free(pVVar5);
    p->vCopyMiniLut = (Vec_Int_t *)0x0;
  }
LAB_0034ce43:
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  if (p->pBoxes != (int *)0x0) {
    free(p->pBoxes);
  }
  free(p);
  s_GlobalFrame = (Abc_Frame_t *)0x0;
  return;
}

Assistant:

void Abc_FrameDeallocate( Abc_Frame_t * p )
{
    extern void Rwt_ManGlobalStop();
    extern void undefine_cube_size();
//    extern void Ivy_TruthManStop();
//    Abc_HManStop();
//    undefine_cube_size();
    Rwt_ManGlobalStop();
//    Ivy_TruthManStop();
    if ( p->vAbcObjIds)  Vec_IntFree( p->vAbcObjIds );
    if ( p->vCexVec   )  Vec_PtrFreeFree( p->vCexVec );
    if ( p->vPoEquivs )  Vec_VecFree( (Vec_Vec_t *)p->vPoEquivs );
    if ( p->vStatuses )  Vec_IntFree( p->vStatuses );
    if ( p->pManDec   )  Dec_ManStop( (Dec_Man_t *)p->pManDec );
#ifdef ABC_USE_CUDD
    if ( p->dd        )  Extra_StopManager( p->dd );
#endif
    if ( p->vStore    )  Vec_PtrFree( p->vStore );
    if ( p->pSave1    )  Aig_ManStop( (Aig_Man_t *)p->pSave1 );
    if ( p->pSave2    )  Aig_ManStop( (Aig_Man_t *)p->pSave2 );
    if ( p->pSave3    )  Aig_ManStop( (Aig_Man_t *)p->pSave3 );
    if ( p->pSave4    )  Aig_ManStop( (Aig_Man_t *)p->pSave4 );
    if ( p->pManDsd   )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd, 0 );
    if ( p->pManDsd2  )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd2, 0 );
    if ( p->pNtkBackup)  Abc_NtkDelete( p->pNtkBackup );
    if ( p->vPlugInComBinPairs ) 
    {
        char * pTemp;
        int i;
        Vec_PtrForEachEntry( char *, p->vPlugInComBinPairs, pTemp, i )
            ABC_FREE( pTemp );
        Vec_PtrFree( p->vPlugInComBinPairs );
    }
    Vec_IntFreeP( &p->vIndFlops );
    Vec_PtrFreeP( &p->vLTLProperties_global );
    if ( p->vSignalNames )
    Vec_PtrFreeFree( p->vSignalNames );
    ABC_FREE( p->pSpecName );
    Abc_FrameDeleteAllNetworks( p );
    ABC_FREE( p->pDrivingCell );
    ABC_FREE( p->pCex2 );
    ABC_FREE( p->pCex );
    Vec_IntFreeP( &p->pAbcWlcInv );
    Abc_NamDeref( s_GlobalFrame->pJsonStrs );
    Vec_WecFreeP( &s_GlobalFrame->vJsonObjs );  
    Ndr_Delete( s_GlobalFrame->pNdr );
    ABC_FREE( s_GlobalFrame->pNdrArray );

    Gia_ManStopP( &p->pGiaMiniAig );
    Gia_ManStopP( &p->pGiaMiniLut );
    Vec_IntFreeP( &p->vCopyMiniAig );
    Vec_IntFreeP( &p->vCopyMiniLut );
    ABC_FREE( p->pArray );
    ABC_FREE( p->pBoxes );
    

    ABC_FREE( p );
    s_GlobalFrame = NULL;
}